

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct-utils.h
# Opt level: O1

void __thiscall
wasm::StructUtils::TypeHierarchyPropagator<wasm::(anonymous_namespace)::FieldInfo>::propagate
          (TypeHierarchyPropagator<wasm::(anonymous_namespace)::FieldInfo> *this,
          StructValuesMap<wasm::(anonymous_namespace)::FieldInfo> *combinedInfos,bool toSubTypes,
          bool toSuperTypes)

{
  pointer pFVar1;
  pointer pFVar2;
  pointer pFVar3;
  pointer pFVar4;
  pointer pHVar5;
  HeapType type_00;
  bool bVar6;
  StructValues<wasm::(anonymous_namespace)::FieldInfo> *pSVar7;
  StructValues<wasm::(anonymous_namespace)::FieldInfo> *pSVar8;
  Struct *pSVar9;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *pvVar10;
  ulong uVar11;
  __node_base *p_Var12;
  pointer pHVar13;
  ulong uVar14;
  optional<wasm::HeapType> oVar15;
  undefined1 auStack_108 [8];
  UniqueDeferredQueue<wasm::HeapType> work;
  optional<wasm::HeapType> superType;
  HeapType local_40;
  HeapType type;
  StructValuesMap<wasm::(anonymous_namespace)::FieldInfo> *__range3;
  
  work.data.c.super__Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  work.data.c.super__Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  work.data.c.super__Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  work.data.c.super__Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  work.data.c.super__Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  work.data.c.super__Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  work.data.c.super__Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  work.data.c.super__Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  auStack_108 = (undefined1  [8])0x0;
  work.data.c.super__Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  std::_Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::_M_initialize_map
            ((_Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_108,0);
  work.data.c.super__Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node =
       (_Map_pointer)&work.count._M_h._M_rehash_policy._M_next_resize;
  work.count._M_h._M_buckets = (__buckets_ptr)0x1;
  work.count._M_h._M_bucket_count = 0;
  work.count._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  work.count._M_h._M_element_count._0_4_ = 0x3f800000;
  work.count._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  work.count._M_h._M_rehash_policy._4_4_ = 0;
  work.count._M_h._M_rehash_policy._M_next_resize = 0;
  p_Var12 = &(combinedInfos->
             super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
             )._M_h._M_before_begin;
  type.id = (uintptr_t)combinedInfos;
  while (p_Var12 = p_Var12->_M_nxt, p_Var12 != (__node_base *)0x0) {
    UniqueDeferredQueue<wasm::HeapType>::push
              ((UniqueDeferredQueue<wasm::HeapType> *)auStack_108,(HeapType)p_Var12[1]._M_nxt);
  }
  do {
    if (((long)((long)work.data.c.super__Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_first -
               work.data.c.super__Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
               _M_impl.super__Deque_impl_data._M_map_size) >> 3) +
        ((long)work.data.c.super__Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
               _M_impl.super__Deque_impl_data._M_start._M_node -
         (long)work.data.c.super__Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_cur >> 3) +
        ((((ulong)((long)work.data.c.
                         super__Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                         super__Deque_impl_data._M_finish._M_last -
                  (long)work.data.c.
                        super__Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                        super__Deque_impl_data._M_start._M_last) >> 3) - 1) +
        (ulong)(work.data.c.super__Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_last == (_Elt_pointer)0x0)) * 0x40 == 0)
    {
      std::
      _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_long>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_long>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)((long)&work.data.c.
                               super__Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                               _M_impl.super__Deque_impl_data._M_finish + 0x18));
      std::_Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Deque_base
                ((_Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_108);
      return;
    }
    local_40 = UniqueDeferredQueue<wasm::HeapType>::pop
                         ((UniqueDeferredQueue<wasm::HeapType> *)auStack_108);
    pSVar7 = StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>::operator[]
                       ((StructValuesMap<wasm::(anonymous_namespace)::FieldInfo> *)type.id,local_40)
    ;
    if (toSubTypes) {
      oVar15 = HeapType::getSuperType(&local_40);
      work.count._M_h._M_single_bucket =
           oVar15.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::HeapType>._M_payload;
      if (((undefined1  [16])
           oVar15.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) !=
          (undefined1  [16])0x0) {
        pSVar8 = StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>::operator[]
                           ((StructValuesMap<wasm::(anonymous_namespace)::FieldInfo> *)type.id,
                            (HeapType)work.count._M_h._M_single_bucket);
        pSVar9 = HeapType::getStruct((HeapType *)&work.count._M_h._M_single_bucket);
        if ((pSVar9->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            (pSVar9->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
            super__Vector_impl_data._M_start) {
          uVar11 = 0;
          uVar14 = 1;
          do {
            pFVar1 = (pSVar8->
                     super_vector<wasm::(anonymous_namespace)::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::FieldInfo>_>
                     ).
                     super__Vector_base<wasm::(anonymous_namespace)::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::FieldInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if (((ulong)((long)(pSVar8->
                               super_vector<wasm::(anonymous_namespace)::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::FieldInfo>_>
                               ).
                               super__Vector_base<wasm::(anonymous_namespace)::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::FieldInfo>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar1 >> 1) <=
                 uVar11) ||
               (pFVar2 = (pSVar7->
                         super_vector<wasm::(anonymous_namespace)::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::FieldInfo>_>
                         ).
                         super__Vector_base<wasm::(anonymous_namespace)::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::FieldInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start,
               (ulong)((long)(pSVar7->
                             super_vector<wasm::(anonymous_namespace)::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::FieldInfo>_>
                             ).
                             super__Vector_base<wasm::(anonymous_namespace)::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::FieldInfo>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar2 >> 1) <=
               uVar11)) {
LAB_0071ac06:
              __assert_fail("index < this->size()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/struct-utils.h"
                            ,0x22,
                            "T &wasm::StructUtils::StructValues<wasm::(anonymous namespace)::FieldInfo>::operator[](size_t) [T = wasm::(anonymous namespace)::FieldInfo]"
                           );
            }
            if ((pFVar1[uVar11].hasWrite == false) && (pFVar2[uVar11].hasWrite == true)) {
              pFVar1[uVar11].hasWrite = true;
              bVar6 = true;
            }
            else {
              bVar6 = false;
            }
            if ((pFVar1[uVar11].hasRead == false) && (pFVar2[uVar11].hasRead == true)) {
              pFVar1[uVar11].hasRead = true;
              bVar6 = true;
            }
            if (bVar6) {
              UniqueDeferredQueue<wasm::HeapType>::push
                        ((UniqueDeferredQueue<wasm::HeapType> *)auStack_108,
                         (HeapType)work.count._M_h._M_single_bucket);
            }
            bVar6 = uVar14 < (ulong)((long)(pSVar9->fields).
                                           super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(pSVar9->fields).
                                           super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>
                                           ._M_impl.super__Vector_impl_data._M_start >> 4);
            uVar11 = uVar14;
            uVar14 = (ulong)((int)uVar14 + 1);
          } while (bVar6);
        }
      }
    }
    pSVar9 = HeapType::getStruct(&local_40);
    pFVar3 = (pSVar9->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
             super__Vector_impl_data._M_start;
    pFVar4 = (pSVar9->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pvVar10 = SubTypes::getStrictSubTypes(&this->subTypes,local_40);
    pHVar13 = (pvVar10->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl
              .super__Vector_impl_data._M_start;
    pHVar5 = (pvVar10->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (pHVar13 != pHVar5) {
      do {
        type_00.id = pHVar13->id;
        pSVar8 = StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>::operator[]
                           ((StructValuesMap<wasm::(anonymous_namespace)::FieldInfo> *)type.id,
                            type_00);
        if (pFVar4 != pFVar3) {
          uVar11 = 0;
          uVar14 = 1;
          do {
            pFVar1 = (pSVar8->
                     super_vector<wasm::(anonymous_namespace)::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::FieldInfo>_>
                     ).
                     super__Vector_base<wasm::(anonymous_namespace)::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::FieldInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if (((ulong)((long)(pSVar8->
                               super_vector<wasm::(anonymous_namespace)::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::FieldInfo>_>
                               ).
                               super__Vector_base<wasm::(anonymous_namespace)::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::FieldInfo>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar1 >> 1) <=
                 uVar11) ||
               (pFVar2 = (pSVar7->
                         super_vector<wasm::(anonymous_namespace)::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::FieldInfo>_>
                         ).
                         super__Vector_base<wasm::(anonymous_namespace)::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::FieldInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start,
               (ulong)((long)(pSVar7->
                             super_vector<wasm::(anonymous_namespace)::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::FieldInfo>_>
                             ).
                             super__Vector_base<wasm::(anonymous_namespace)::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::FieldInfo>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar2 >> 1) <=
               uVar11)) goto LAB_0071ac06;
            if ((pFVar1[uVar11].hasWrite == false) && (pFVar2[uVar11].hasWrite == true)) {
              pFVar1[uVar11].hasWrite = true;
              bVar6 = true;
            }
            else {
              bVar6 = false;
            }
            if ((pFVar1[uVar11].hasRead == false) && (pFVar2[uVar11].hasRead == true)) {
              pFVar1[uVar11].hasRead = true;
              bVar6 = true;
            }
            if (bVar6) {
              UniqueDeferredQueue<wasm::HeapType>::push
                        ((UniqueDeferredQueue<wasm::HeapType> *)auStack_108,type_00);
            }
            bVar6 = uVar14 < (ulong)((long)pFVar4 - (long)pFVar3 >> 4);
            uVar11 = uVar14;
            uVar14 = (ulong)((int)uVar14 + 1);
          } while (bVar6);
        }
        pHVar13 = pHVar13 + 1;
      } while (pHVar13 != pHVar5);
    }
  } while( true );
}

Assistant:

void propagate(StructValuesMap<T>& combinedInfos,
                 bool toSubTypes,
                 bool toSuperTypes) {
    UniqueDeferredQueue<HeapType> work;
    for (auto& [type, _] : combinedInfos) {
      work.push(type);
    }
    while (!work.empty()) {
      auto type = work.pop();
      auto& infos = combinedInfos[type];

      if (toSuperTypes) {
        // Propagate shared fields to the supertype.
        if (auto superType = type.getSuperType()) {
          auto& superInfos = combinedInfos[*superType];
          auto& superFields = superType->getStruct().fields;
          for (Index i = 0; i < superFields.size(); i++) {
            if (superInfos[i].combine(infos[i])) {
              work.push(*superType);
            }
          }
        }
      }

      if (toSubTypes) {
        // Propagate shared fields to the subtypes.
        auto numFields = type.getStruct().fields.size();
        for (auto subType : subTypes.getStrictSubTypes(type)) {
          auto& subInfos = combinedInfos[subType];
          for (Index i = 0; i < numFields; i++) {
            if (subInfos[i].combine(infos[i])) {
              work.push(subType);
            }
          }
        }
      }
    }
  }